

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.cpp
# Opt level: O1

bool zelCheckIsLoaderInTearDown(void)

{
  return (bool)(ze_lib::context == 0 | ze_lib::destruction);
}

Assistant:

bool ZE_APICALL
zelCheckIsLoaderInTearDown() {
    if (ze_lib::destruction || ze_lib::context == nullptr) {
        return true;
    }
    #if defined(DYNAMIC_LOAD_LOADER) && defined(_WIN32)
    std::promise<int> stabilityPromise;
    std::future<int> resultFuture = stabilityPromise.get_future();
    int result = -1;
    try {
        // Launch the stability checker thread
        std::thread stabilityThread(stabilityCheck, std::move(stabilityPromise));
        result = resultFuture.get(); // Blocks until the result is available
        stabilityThread.join();
    } catch (const std::exception& e) {
        if (ze_lib::context->debugTraceEnabled) {
            std::string message = "Exception caught in parent thread: " + std::string(e.what());
            ze_lib::context->debug_trace_message(message, "");
        }
    } catch (...) {
        if (ze_lib::context->debugTraceEnabled) {
            std::string message = "Unknown exception caught in parent thread.";
            ze_lib::context->debug_trace_message(message, "");
        }
    }
    if (result != ZEL_STABILITY_CHECK_RESULT_SUCCESS) {
        if (ze_lib::context->debugTraceEnabled) {
            std::string message = "Loader stability check failed with result: " + std::to_string(result);
            ze_lib::context->debug_trace_message(message, "");
        }
        return true;
    }
    #endif
    return false;
}